

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_positional_join.cpp
# Opt level: O1

void __thiscall
duckdb::PositionalJoinGlobalState::GetData(PositionalJoinGlobalState *this,DataChunk *output)

{
  int iVar1;
  reference this_00;
  idx_t col_offset;
  size_type __n;
  idx_t count;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->rhs_lock);
  if (iVar1 == 0) {
    InitializeScan(this);
    Refill(this);
    if (this->exhausted == false) {
      col_offset = ((long)(this->source).data.
                          super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->source).data.
                          super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 3) * -0x4ec4ec4ec4ec4ec5 +
                   ((long)(output->data).
                          super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(output->data).
                          super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
      if (col_offset != 0) {
        __n = 0;
        do {
          this_00 = vector<duckdb::Vector,_true>::operator[](&output->data,__n);
          Vector::SetVectorType(this_00,CONSTANT_VECTOR);
          ConstantVector::SetNull(this_00,true);
          __n = __n + 1;
        } while (col_offset != __n);
      }
      count = (this->source).count - this->source_offset;
      if (0x7ff < count) {
        count = 0x800;
      }
      CopyData(this,output,count,col_offset);
    }
    else {
      count = 0;
    }
    output->count = count;
    pthread_mutex_unlock((pthread_mutex_t *)&this->rhs_lock);
    return;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

void PositionalJoinGlobalState::GetData(DataChunk &output) {
	lock_guard<mutex> client_guard(rhs_lock);

	InitializeScan();
	Refill();

	//	LHS exhausted
	if (exhausted) {
		//	RHS exhausted too, so we are done
		output.SetCardinality(0);
		return;
	}

	//	LHS is all NULL
	const auto col_offset = output.ColumnCount() - source.ColumnCount();
	for (idx_t i = 0; i < col_offset; ++i) {
		auto &vec = output.data[i];
		vec.SetVectorType(VectorType::CONSTANT_VECTOR);
		ConstantVector::SetNull(vec, true);
	}

	//	RHS still has data, so copy it
	const auto count = MinValue<idx_t>(STANDARD_VECTOR_SIZE, source.size() - source_offset);
	CopyData(output, count, col_offset);
	output.SetCardinality(count);
}